

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

CURLcode Curl_cpool_upkeep(void *data)

{
  long lVar1;
  cpool *cpool;
  curltime cVar2;
  curltime now;
  time_t local_20;
  int local_18;
  
  if (data == (void *)0x0) {
    cpool = (cpool *)0x0;
  }
  else {
    lVar1 = *(long *)((long)data + 0x78);
    if ((lVar1 == 0) || ((*(byte *)(lVar1 + 4) & 0x20) == 0)) {
      if (*(long *)((long)data + 0x70) == 0) {
        cpool = (cpool *)(*(long *)((long)data + 0x68) + 0x1b8);
        if (*(long *)((long)data + 0x68) == 0) {
          cpool = (cpool *)0x0;
        }
      }
      else {
        cpool = (cpool *)(*(long *)((long)data + 0x70) + 0x1b8);
      }
    }
    else {
      cpool = (cpool *)(lVar1 + 0x30);
    }
  }
  cVar2 = Curl_now();
  local_20 = cVar2.tv_sec;
  local_18 = cVar2.tv_usec;
  if (cpool != (cpool *)0x0) {
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock((Curl_easy *)data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x68 = cpool->field_0x68 | 1;
    cpool_foreach((Curl_easy *)data,cpool,&local_20,conn_upkeep);
    cpool->field_0x68 = cpool->field_0x68 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock((Curl_easy *)data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cpool_upkeep(void *data)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct curltime now = Curl_now();

  if(!cpool)
    return CURLE_OK;

  CPOOL_LOCK(cpool, data);
  cpool_foreach(data, cpool, &now, conn_upkeep);
  CPOOL_UNLOCK(cpool, data);
  return CURLE_OK;
}